

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O0

uint32_t FACTWave_Pause(FACTWave *pWave,int32_t fPause)

{
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint32_t uVar1;
  
  if (in_RDI == 0) {
    uVar1 = 1;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x116319);
    if ((*(uint *)(in_RDI + 0x20) & 0x30) == 0) {
      uVar1 = (uint32_t)((ulong)in_RDI >> 0x20);
      if (in_ESI == 0) {
        *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) & 0xffffffbf;
        FAudioSourceVoice_Start
                  ((FAudioSourceVoice *)
                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar1,
                   (uint32_t)in_RDI);
      }
      else {
        *(uint *)(in_RDI + 0x20) = *(uint *)(in_RDI + 0x20) | 0x40;
        FAudioSourceVoice_Stop
                  ((FAudioSourceVoice *)
                   CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),uVar1,
                   (uint32_t)in_RDI);
      }
      FAudio_PlatformUnlockMutex((FAudioMutex)0x1163aa);
      uVar1 = 0;
    }
    else {
      FAudio_PlatformUnlockMutex((FAudioMutex)0x116340);
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

uint32_t FACTWave_Pause(FACTWave *pWave, int32_t fPause)
{
	if (pWave == NULL)
	{
		return 1;
	}
	FAudio_PlatformLockMutex(pWave->parentBank->parentEngine->apiLock);

	/* FIXME: Does the Cue STOPPING/STOPPED rule apply here too? */
	if (pWave->state & (FACT_STATE_STOPPING | FACT_STATE_STOPPED))
	{
		FAudio_PlatformUnlockMutex(
			pWave->parentBank->parentEngine->apiLock
		);
		return 0;
	}

	/* All we do is set the flag, the mixer handles the rest */
	if (fPause)
	{
		pWave->state |= FACT_STATE_PAUSED;
		FAudioSourceVoice_Stop(pWave->voice, 0, 0);
	}
	else
	{
		pWave->state &= ~FACT_STATE_PAUSED;
		FAudioSourceVoice_Start(pWave->voice, 0, 0);
	}

	FAudio_PlatformUnlockMutex(pWave->parentBank->parentEngine->apiLock);
	return 0;
}